

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnDelegateExpr(BinaryReaderIR *this,Index depth)

{
  Index index;
  bool bVar1;
  Location local_a0;
  Var local_80;
  TryExpr *local_38;
  TryExpr *try_;
  LabelNode *local_28;
  LabelNode *label;
  BinaryReaderIR *pBStack_18;
  Index depth_local;
  BinaryReaderIR *this_local;
  
  local_28 = (LabelNode *)0x0;
  label._4_4_ = depth;
  pBStack_18 = this;
  try_._4_4_ = TopLabel(this,&local_28);
  bVar1 = Failed(try_._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (local_28->label_type == Try) {
    local_38 = cast<wabt::TryExpr,wabt::Expr>(local_28->context);
    index = label._4_4_;
    if (local_38->kind == Plain) {
      local_38->kind = Delegate;
    }
    else if (local_38->kind != Delegate) {
      PrintError(this,"delegate not allowed in try-catch");
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    GetLocation(&local_a0,this);
    Var::Var(&local_80,index,&local_a0);
    Var::operator=(&local_38->delegate_target,&local_80);
    Var::~Var(&local_80);
    PopLabel(this);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"delegate not inside try block");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnDelegateExpr(Index depth) {
  LabelNode* label = nullptr;
  CHECK_RESULT(TopLabel(&label));

  if (label->label_type != LabelType::Try) {
    PrintError("delegate not inside try block");
    return Result::Error;
  }

  auto* try_ = cast<TryExpr>(label->context);

  if (try_->kind == TryKind::Plain) {
    try_->kind = TryKind::Delegate;
  } else if (try_->kind != TryKind::Delegate) {
    PrintError("delegate not allowed in try-catch");
    return Result::Error;
  }

  try_->delegate_target = Var(depth, GetLocation());

  PopLabel();
  return Result::Ok;
}